

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManDumpGnuplot(Emb_Man_t *p,char *pName,int fDumpLarge,int fShowImage)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  FILE *__stream;
  Vec_Int_t *p_00;
  bool bVar9;
  Vec_Int_t *vLines;
  int endY;
  int endX;
  int begY;
  int begX;
  int k;
  int i;
  Emb_Obj_t *pNext;
  Emb_Obj_t *pThis;
  char Buffer [1000];
  FILE *pFile;
  char *pDirectory;
  int fShowImage_local;
  int fDumpLarge_local;
  char *pName_local;
  Emb_Man_t *p_local;
  
  if (p->pPlacement == (unsigned_short *)0x0) {
    printf("Emb_ManDumpGnuplot(): Placement is not available.\n");
  }
  else {
    pcVar8 = Gia_FileNameGenericAppend(pName,".plt");
    sprintf((char *)&pThis,"%s%s","",pcVar8);
    __stream = fopen((char *)&pThis,"w");
    Buffer._992_8_ = __stream;
    pcVar8 = Ioa_TimeStamp();
    fprintf(__stream,"# This Gnuplot file was produced by ABC on %s\n",pcVar8);
    fprintf((FILE *)Buffer._992_8_,"\n");
    fprintf((FILE *)Buffer._992_8_,"set nokey\n");
    fprintf((FILE *)Buffer._992_8_,"\n");
    if (fShowImage == 0) {
      fprintf((FILE *)Buffer._992_8_,
              "set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n");
      uVar1 = Buffer._992_8_;
      pcVar8 = Gia_FileNameGenericAppend(pName,".gif");
      fprintf((FILE *)uVar1,"set output \'%s\'\n",pcVar8);
      fprintf((FILE *)Buffer._992_8_,"\n");
    }
    uVar1 = Buffer._992_8_;
    uVar2 = Emb_ManPiNum(p);
    uVar3 = Emb_ManPoNum(p);
    uVar4 = Emb_ManRegNum(p);
    iVar5 = Emb_ManNodeNum(p);
    iVar6 = Emb_ManObjNum(p);
    Emb_ManComputeHPWL(p);
    fprintf((FILE *)uVar1,
            "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n",
            pName,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,iVar5,iVar6);
    uVar1 = Buffer._992_8_;
    pcVar8 = Ioa_TimeStamp();
    fprintf((FILE *)uVar1,"(image generated by ABC and Gnuplot on %s)\"",pcVar8);
    fprintf((FILE *)Buffer._992_8_,"font \"Times, 12\"\n");
    fprintf((FILE *)Buffer._992_8_,"\n");
    fprintf((FILE *)Buffer._992_8_,"plot [:] \'-\' w l\n");
    fprintf((FILE *)Buffer._992_8_,"\n");
    if (fDumpLarge == 0) {
      begX = 0;
      while( true ) {
        bVar9 = false;
        if (begX < p->nObjData) {
          pNext = Emb_ManObj(p,begX);
          bVar9 = pNext != (Emb_Obj_t *)0x0;
        }
        if (!bVar9) break;
        iVar5 = Emb_ObjIsTravIdCurrent(p,pNext);
        if (iVar5 != 0) {
          begY = 0;
          while( true ) {
            bVar9 = false;
            if (begY < (int)pNext->nFanouts) {
              _k = Emb_ObjFanout(pNext,begY);
              bVar9 = _k != (Emb_Obj_t *)0x0;
            }
            if (!bVar9) break;
            iVar5 = Emb_ObjIsTravIdCurrent(p,_k);
            if (iVar5 == 0) {
              __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                            ,0x6da,"void Emb_ManDumpGnuplot(Emb_Man_t *, char *, int, int)");
            }
            fprintf((FILE *)Buffer._992_8_,"%5d %5d\n",
                    (ulong)p->pPlacement[(pNext->field_8).Value << 1],
                    (ulong)p->pPlacement[(pNext->field_8).Value * 2 + 1]);
            fprintf((FILE *)Buffer._992_8_,"%5d %5d\n",
                    (ulong)p->pPlacement[(_k->field_8).Value << 1],
                    (ulong)p->pPlacement[(_k->field_8).Value * 2 + 1]);
            fprintf((FILE *)Buffer._992_8_,"\n");
            begY = begY + 1;
          }
        }
        iVar5 = Emb_ObjSize(pNext);
        begX = iVar5 + begX;
      }
    }
    else {
      p_00 = Emb_ManDumpGnuplotPrepare(p);
      for (begX = 0; iVar5 = Vec_IntSize(p_00), begX < iVar5; begX = begX + 4) {
        uVar2 = Vec_IntEntry(p_00,begX);
        uVar3 = Vec_IntEntry(p_00,begX + 1);
        uVar4 = Vec_IntEntry(p_00,begX + 2);
        uVar7 = Vec_IntEntry(p_00,begX + 3);
        fprintf((FILE *)Buffer._992_8_,"%5d %5d\n",(ulong)uVar2,(ulong)uVar3);
        fprintf((FILE *)Buffer._992_8_,"%5d %5d\n",(ulong)uVar4,(ulong)uVar7);
        fprintf((FILE *)Buffer._992_8_,"\n");
      }
      Vec_IntFree(p_00);
    }
    fprintf((FILE *)Buffer._992_8_,"EOF\n");
    fprintf((FILE *)Buffer._992_8_,"\n");
    if (fShowImage == 0) {
      fprintf((FILE *)Buffer._992_8_,"# pause -1 \"Close window\"\n");
      fprintf((FILE *)Buffer._992_8_,"# reset\n");
      fprintf((FILE *)Buffer._992_8_,"\n");
    }
    else {
      fprintf((FILE *)Buffer._992_8_,"pause -1 \"Close window\"\n");
      fprintf((FILE *)Buffer._992_8_,"reset\n");
      fprintf((FILE *)Buffer._992_8_,"\n");
    }
    fclose((FILE *)Buffer._992_8_);
    if (fShowImage != 0) {
      Gia_ManGnuplotShow((char *)&pThis);
    }
  }
  return;
}

Assistant:

void Emb_ManDumpGnuplot( Emb_Man_t * p, char * pName, int fDumpLarge, int fShowImage )
{
    extern void Gia_ManGnuplotShow( char * pPlotFileName );
//    char * pDirectory = "place\\";
    char * pDirectory = "";
//    extern char * Ioa_TimeStamp();
    FILE * pFile;
    char Buffer[1000];
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    if ( p->pPlacement == NULL )
    {
        printf( "Emb_ManDumpGnuplot(): Placement is not available.\n" );
        return;
    }
    sprintf( Buffer, "%s%s", pDirectory, Gia_FileNameGenericAppend(pName, ".plt") ); 
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# This Gnuplot file was produced by ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "\n" );
    fprintf( pFile, "set nokey\n" );
    fprintf( pFile, "\n" );
    if ( !fShowImage )
    {
//    fprintf( pFile, "set terminal postscript\n" );
    fprintf( pFile, "set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n" );
    fprintf( pFile, "set output \'%s\'\n", Gia_FileNameGenericAppend(pName, ".gif") );
    fprintf( pFile, "\n" );
    }
    fprintf( pFile, "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n", 
        pName, Emb_ManPiNum(p), Emb_ManPoNum(p), Emb_ManRegNum(p), Emb_ManNodeNum(p), Emb_ManObjNum(p), Emb_ManComputeHPWL(p) );
    fprintf( pFile, "(image generated by ABC and Gnuplot on %s)\"", Ioa_TimeStamp() );
    fprintf( pFile, "font \"Times, 12\"\n" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "plot [:] '-' w l\n" );
    fprintf( pFile, "\n" );
    if ( fDumpLarge )
    {
        int begX, begY, endX, endY;
        Vec_Int_t * vLines = Emb_ManDumpGnuplotPrepare( p );
        Vec_IntForEachEntry( vLines, begX, i )
        {
            begY = Vec_IntEntry( vLines, i+1 );
            endX = Vec_IntEntry( vLines, i+2 );
            endY = Vec_IntEntry( vLines, i+3 );
            i += 3;
            fprintf( pFile, "%5d %5d\n", begX, begY );
            fprintf( pFile, "%5d %5d\n", endX, endY );
            fprintf( pFile, "\n" );
        }
        Vec_IntFree( vLines );
    }
    else
    {
        Emb_ManForEachObj( p, pThis, i )
        {
            if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
                continue;
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                assert( Emb_ObjIsTravIdCurrent(p, pNext) );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pThis->Value+0], p->pPlacement[2*pThis->Value+1] );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pNext->Value+0], p->pPlacement[2*pNext->Value+1] );
                fprintf( pFile, "\n" );
            }
        }
    }
    fprintf( pFile, "EOF\n" );
    fprintf( pFile, "\n" );
    if ( fShowImage )
    {
    fprintf( pFile, "pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "reset\n" );
    fprintf( pFile, "\n" );
    }
    else
    {
    fprintf( pFile, "# pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "# reset\n" );
    fprintf( pFile, "\n" );
    }
    fclose( pFile );
    if ( fShowImage )
        Gia_ManGnuplotShow( Buffer );
}